

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAig.c
# Opt level: O2

void Gia_ManFromAig_rec(Gia_Man_t *pNew,Aig_Man_t *p,Aig_Obj_t *pObj)

{
  Aig_Obj_t *pObj_00;
  int iVar1;
  int iLit1;
  uint uVar2;
  
  if ((pObj->field_5).iData == 0) {
    if ((*(uint *)&pObj->field_0x18 & 7) - 7 < 0xfffffffe) {
      __assert_fail("Aig_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaAig.c"
                    ,0x3b,"void Gia_ManFromAig_rec(Gia_Man_t *, Aig_Man_t *, Aig_Obj_t *)");
    }
    Gia_ManFromAig_rec(pNew,p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
    Gia_ManFromAig_rec(pNew,p,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe));
    iVar1 = Gia_ObjChild0Copy(pObj);
    iLit1 = Gia_ObjChild1Copy(pObj);
    iVar1 = Gia_ManAppendAnd(pNew,iVar1,iLit1);
    (pObj->field_5).iData = iVar1;
    if ((p->pEquivs != (Aig_Obj_t **)0x0) &&
       (pObj_00 = p->pEquivs[pObj->Id], pObj_00 != (Aig_Obj_t *)0x0)) {
      Gia_ManFromAig_rec(pNew,p,pObj_00);
      uVar2 = Abc_Lit2Var((pObj->field_5).iData);
      iVar1 = Abc_Lit2Var((pObj_00->field_5).iData);
      if (pNew->pNexts != (int *)0x0) {
        pNew->pNexts[uVar2] = iVar1;
      }
    }
  }
  return;
}

Assistant:

void Gia_ManFromAig_rec( Gia_Man_t * pNew, Aig_Man_t * p, Aig_Obj_t * pObj )
{
    Aig_Obj_t * pNext;
    if ( pObj->iData )
        return;
    assert( Aig_ObjIsNode(pObj) );
    Gia_ManFromAig_rec( pNew, p, Aig_ObjFanin0(pObj) );
    Gia_ManFromAig_rec( pNew, p, Aig_ObjFanin1(pObj) );
    pObj->iData = Gia_ManAppendAnd( pNew, Gia_ObjChild0Copy(pObj), Gia_ObjChild1Copy(pObj) );
    if ( p->pEquivs && (pNext = Aig_ObjEquiv(p, pObj)) )
    {
        int iObjNew, iNextNew;
        Gia_ManFromAig_rec( pNew, p, pNext );
        iObjNew  = Abc_Lit2Var(pObj->iData);
        iNextNew = Abc_Lit2Var(pNext->iData);
        if ( pNew->pNexts )
            pNew->pNexts[iObjNew] = iNextNew;        
    }
}